

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::DFARoutineEM64T<unsigned_char>::DFARoutineEM64T
          (DFARoutineEM64T<unsigned_char> *this,DFA<unsigned_char> *dfa,Logger *logger)

{
  CodeHolder *code;
  CodeHolder *this_00;
  Logger *logger_00;
  uint32_t instId;
  undefined8 in_stack_fffffffffffffd38;
  Label rejectlabel;
  undefined1 local_2a8 [8];
  MyConstPool pool;
  undefined1 local_180 [8];
  X86Assembler as;
  Logger *logger_local;
  DFA<unsigned_char> *dfa_local;
  DFARoutineEM64T<unsigned_char> *this_local;
  uint32_t signature;
  
  this->_vptr_DFARoutineEM64T = (_func_int **)&PTR__DFARoutineEM64T_00279738;
  this_00 = (CodeHolder *)&this->m_runtime;
  as.super_Assembler._op5.field_0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)logger;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)this_00);
  logger_00 = (Logger *)&this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (as.super_Assembler._op5.field_0._mem.field_2 != 0) {
    asmjit::CodeHolder::setLogger((CodeHolder *)this,logger_00);
  }
  instId = (uint32_t)((ulong)logger_00 >> 0x20);
  code = (CodeHolder *)local_180;
  asmjit::X86Assembler::X86Assembler((X86Assembler *)this_00,code);
  emit_parser_prolog((X86Assembler *)code);
  MyConstPool::MyConstPool((MyConstPool *)local_2a8,(X86Assembler *)local_180);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)this_00,(Operand_ *)code);
  asmjit::Assembler::newLabel((Assembler *)in_stack_fffffffffffffd38);
  emit((X86Assembler *)local_180,(Label *)&stack0xfffffffffffffd38,dfa,(MyConstPool *)local_2a8);
  emit_parser_epilog((X86Assembler *)local_180,(Label *)&stack0xfffffffffffffd38);
  MyConstPool::embed((MyConstPool *)local_2a8);
  asmjit::CodeEmitter::finalize((CodeEmitter *)local_180);
  MyConstPool::~MyConstPool((MyConstPool *)local_2a8);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x16c9cc);
  return;
}

Assistant:

DFARoutineEM64T<TCHAR>::DFARoutineEM64T(const DFA<TCHAR>& dfa, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

	MyConstPool pool(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    asmjit::Label rejectlabel = as.newLabel();

    emit(as, rejectlabel, dfa, pool);

    emit_parser_epilog(as, rejectlabel);

	pool.embed();

    as.finalize();
}